

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<std::complex<float>_>::CompareValues
          (TPZMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *M,
          complex<float> tol)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  int64_t j;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 in_XMM0_Db;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  
  lVar6 = (this->super_TPZBaseMatrix).fRow;
  bVar3 = false;
  if (((M->super_TPZBaseMatrix).fRow == lVar6) &&
     (lVar4 = (this->super_TPZBaseMatrix).fCol, bVar3 = false,
     (M->super_TPZBaseMatrix).fCol == lVar4)) {
    lVar7 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar7;
    }
    if (lVar6 < 1) {
      lVar6 = lVar7;
    }
    for (; lVar7 != lVar6; lVar7 = lVar7 + 1) {
      lVar5 = 0;
      while (lVar4 != lVar5) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar7,lVar5);
        (*(M->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(M,lVar7,lVar5);
        dVar1 = fabs((double)CONCAT44(extraout_XMM0_Db - extraout_XMM0_Db_00,
                                      extraout_XMM0_Da - extraout_XMM0_Da_00));
        dVar2 = fabs((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
        lVar5 = lVar5 + 1;
        if (SUB84(dVar2,0) < SUB84(dVar1,0)) {
          return false;
        }
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool TPZMatrix<TVar>::CompareValues(TPZMatrix<TVar> &M, TVar tol){
	
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if ( (M.Rows() != nrows) || (M.Cols() != ncols) ) return false;
	
	REAL diff;
	for( int64_t i = 0; i < nrows; i++)
		for( int64_t j = 0; j < ncols; j++){
            TVar exps = this->Get(i,j) - M.Get(i,j);
			diff = fabs( exps );
			if (diff > fabs(tol)) return false;
		}
	
	return true;
}